

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<double,float,int(*)(char_const**,double*)>
               (float num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  byte bVar1;
  mp_type mVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  ulong uVar8;
  double dVar9;
  char *pcVar10;
  long lVar11;
  code *pcVar12;
  char *pcVar13;
  byte *__maxlen;
  long lVar14;
  double num2;
  char *mp_num_pos2;
  char str [256];
  char mp_nums [16] [16];
  double dStack_480;
  undefined1 *puStack_478;
  char acStack_470 [256];
  undefined1 uStack_370;
  undefined8 uStack_36f;
  undefined1 auStack_367 [247];
  char *pcStack_270;
  byte *pbStack_268;
  code *pcStack_260;
  double local_250;
  char *local_248;
  _func_int_char_ptr_ptr_double_ptr *local_240;
  char local_238 [256];
  byte local_138;
  undefined8 local_137;
  char acStack_12f [7];
  undefined1 local_128;
  undefined8 local_127;
  
  builtin_strncpy(local_238,"typed read of ",0xf);
  pcStack_260 = (code *)0x131b1e;
  local_240 = read_f;
  iVar5 = snprintf(local_238 + 0xe,0xf2,"%f",0x41590b2200000000);
  pcVar13 = local_238 + (long)iVar5 + 0xe;
  pcStack_260 = (code *)0x131b3f;
  iVar5 = snprintf(pcVar13,(size_t)(&local_138 + -(long)pcVar13)," into ");
  __maxlen = &local_138 + -(long)(pcVar13 + iVar5);
  pcStack_260 = (code *)0x131b59;
  snprintf(pcVar13 + iVar5,(size_t)__maxlen,"double");
  pcStack_260 = (code *)0x131b68;
  _space((FILE *)_stdout);
  lVar14 = 1;
  pcStack_260 = (code *)0x131b87;
  fwrite("# ",2,1,_stdout);
  pcStack_260 = (code *)0x131b94;
  fputs(local_238,_stdout);
  pcVar12 = (code *)0xa;
  pcStack_260 = (code *)0x131ba1;
  fputc(10,_stdout);
  pcVar13 = (char *)((long)&local_137 + 1);
  local_138 = 0xca;
  local_137._0_4_ = 0x1059c84a;
  local_128 = 0xcb;
  local_127 = 0x220b5941;
  lVar11 = 0;
  do {
    lVar6 = lVar11 * 0x10;
    bVar1 = pcVar13[-2];
    uVar8 = (ulong)bVar1;
    mVar2 = mp_type_hint[uVar8];
    pcVar10 = pcVar13;
    if (mVar2 == MP_UINT) {
      switch(bVar1) {
      case 0xcc:
        uVar8 = (ulong)(byte)pcVar13[-1];
        break;
      case 0xcd:
        uVar8 = (ulong)(ushort)(*(ushort *)(pcVar13 + -1) << 8 | *(ushort *)(pcVar13 + -1) >> 8);
        pcVar10 = acStack_12f + lVar6 + -6;
        break;
      case 0xce:
        uVar3 = *(uint *)(pcVar13 + -1);
        uVar8 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18);
        pcVar10 = acStack_12f + lVar6 + -4;
        break;
      case 0xcf:
        uVar8 = *(ulong *)(pcVar13 + -1);
        uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        pcVar10 = acStack_12f + lVar11 * 0x10;
        break;
      default:
        if ((char)bVar1 < '\0') {
LAB_00131e46:
          pcStack_260 = (code *)0x131e4b;
          test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
          pcStack_260 = (code *)0x131e50;
          test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
          pcStack_260 = (code *)0x131e6f;
          __assert_fail("c == 0xcb",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x987,"double mp_decode_double(const char **)");
        }
        pcVar10 = (char *)(&local_137 + lVar11 * 2);
      }
      if (uVar8 != 0x642c88) {
        pcStack_260 = (code *)0x131e98;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
        pcStack_260 = test_read_num<double,double,int(*)(char_const**,double*)>;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        builtin_strncpy(acStack_470,"typed read of ",0xf);
        pcStack_270 = pcVar10;
        pbStack_268 = __maxlen;
        pcStack_260 = (code *)lVar14;
        iVar5 = snprintf(acStack_470 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
        pcVar13 = acStack_470 + (long)iVar5 + 0xe;
        iVar5 = snprintf(pcVar13,(size_t)(&uStack_370 + -(long)pcVar13)," into ");
        snprintf(pcVar13 + iVar5,(size_t)(&uStack_370 + -(long)(pcVar13 + iVar5)),"double");
        _space((FILE *)_stdout);
        fwrite("# ",2,1,_stdout);
        fputs(acStack_470,_stdout);
        fputc(10,_stdout);
        uStack_370 = 0xcb;
        uStack_36f = 0xb81e85eb513816c0;
        puStack_478 = &uStack_370;
        dStack_480 = 0.0;
        iVar5 = (*pcVar12)(&puStack_478,&dStack_480);
        _ok((uint)(iVar5 == 0),"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",0xffffffcb);
        _ok((uint)(auStack_367 == puStack_478),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        _ok((uint)(ABS(-5.555 - dStack_480) < 1e-15),"double_eq(num1, num2)",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73e,"check float number");
        return;
      }
    }
    else if (mVar2 == MP_FLOAT) {
      if (bVar1 != 0xca) {
LAB_00131e74:
        pcStack_260 = (code *)0x131e93;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar3 = *(uint *)(pcVar13 + -1);
      fVar7 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                     uVar3 << 0x18);
      if ((fVar7 != 6.565e+06) || (NAN(fVar7))) goto LAB_00131e4b;
      pcVar10 = pcVar13 + 3;
    }
    else if (mVar2 == MP_INT) {
      uVar8 = (ulong)(char)bVar1;
      switch(bVar1) {
      case 0xd0:
        uVar8 = (ulong)pcVar13[-1];
        break;
      case 0xd1:
        uVar8 = (ulong)(short)(*(ushort *)(pcVar13 + -1) << 8 | *(ushort *)(pcVar13 + -1) >> 8);
        pcVar10 = acStack_12f + lVar6 + -6;
        break;
      case 0xd2:
        uVar3 = *(uint *)(pcVar13 + -1);
        uVar8 = (ulong)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                            uVar3 << 0x18);
        pcVar10 = acStack_12f + lVar6 + -4;
        break;
      case 0xd3:
        uVar8 = *(ulong *)(pcVar13 + -1);
        uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        pcVar10 = acStack_12f + lVar11 * 0x10;
        break;
      default:
        if (bVar1 < 0xe0) {
          pcStack_260 = (code *)0x131e46;
          test_read_num<double,float,int(*)(char_const**,double*)>();
          goto LAB_00131e46;
        }
        pcVar10 = (char *)(&local_137 + lVar11 * 2);
      }
      if (uVar8 != 0x642c88) goto LAB_00131e98;
    }
    else {
      if (bVar1 != 0xcb) goto LAB_00131e50;
      uVar8 = *(ulong *)(pcVar13 + -1);
      dVar9 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                       (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                       (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
      if ((dVar9 != 6565000.0) || (NAN(dVar9))) {
        pcStack_260 = (code *)0x131e74;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e74;
      }
      pcVar10 = acStack_12f + lVar11 * 0x10;
    }
    local_248 = pcVar13 + -2;
    __maxlen = (byte *)(ulong)(uint)(int)(char)bVar1;
    local_250 = 0.0;
    pcStack_260 = (code *)0x131d8a;
    iVar5 = (*local_240)(&local_248,&local_250);
    pcStack_260 = (code *)0x131db2;
    _ok((uint)(iVar5 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",__maxlen);
    pcStack_260 = (code *)0x131dda;
    _ok((uint)(pcVar10 == local_248),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar4 = ABS(6565000.0 - local_250) < 1e-15;
    pcVar12 = (code *)(ulong)bVar4;
    pcStack_260 = (code *)0x131e1f;
    _ok((uint)bVar4,"double_eq(num1, num2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73e,"check float number");
    lVar11 = lVar11 + 1;
    pcVar13 = pcVar13 + 0x10;
    lVar14 = lVar14 + -1;
    if (lVar14 != 0) {
      return;
    }
  } while( true );
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}